

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void sync_dec_workers(AV1Decoder *pbi,int num_workers)

{
  int iVar1;
  int in_ESI;
  long in_RDI;
  AVxWorker *worker;
  int worker_idx;
  int corrupted;
  AVxWorkerInterface *winterface;
  int local_20;
  int local_1c;
  AVxWorkerInterface *local_18;
  int local_c;
  long local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  local_18 = aom_get_worker_interface();
  local_1c = 0;
  for (local_20 = local_c; 0 < local_20; local_20 = local_20 + -1) {
    iVar1 = (*local_18->sync)((AVxWorker *)
                              (*(long *)(local_8 + 0xa120) + (long)(local_20 + -1) * 0x38));
    aom_merge_corrupted_flag(&local_1c,(uint)((iVar1 != 0 ^ 0xffU) & 1));
  }
  *(int *)(local_8 + 0x3ad0) = local_1c;
  return;
}

Assistant:

static inline void sync_dec_workers(AV1Decoder *pbi, int num_workers) {
  const AVxWorkerInterface *const winterface = aom_get_worker_interface();
  int corrupted = 0;

  for (int worker_idx = num_workers; worker_idx > 0; --worker_idx) {
    AVxWorker *const worker = &pbi->tile_workers[worker_idx - 1];
    aom_merge_corrupted_flag(&corrupted, !winterface->sync(worker));
  }

  pbi->dcb.corrupted = corrupted;
}